

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_deletelinesforio(_glist *x,t_text *text,_inlet *inp,_outlet *outp)

{
  _outconnect *oc;
  t_linetraverser t;
  t_linetraverser local_a0;
  
  local_a0.tr_ob = (t_text *)0x0;
  local_a0.tr_nextoc = (_outconnect *)0x0;
  local_a0.tr_nout = 0;
  local_a0.tr_nextoutno = 0;
  local_a0.tr_x = x;
  oc = linetraverser_next(&local_a0);
  if (oc != (_outconnect *)0x0) {
    do {
      if (((local_a0.tr_ob == text) && (local_a0.tr_outlet == outp)) ||
         ((local_a0.tr_ob2 == text && (local_a0.tr_inlet == inp)))) {
        _canvas_delete_line(x,oc);
        obj_disconnect(local_a0.tr_ob,local_a0.tr_outno,local_a0.tr_ob2,local_a0.tr_inno);
      }
      oc = linetraverser_next(&local_a0);
    } while (oc != (_outconnect *)0x0);
  }
  return;
}

Assistant:

void canvas_deletelinesforio(t_canvas *x, t_text *text,
    t_inlet *inp, t_outlet *outp)
{
    t_linetraverser t;
    t_outconnect *oc;
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if ((t.tr_ob == text && t.tr_outlet == outp) ||
            (t.tr_ob2 == text && t.tr_inlet == inp))
        {
            _canvas_delete_line(x, oc);
            obj_disconnect(t.tr_ob, t.tr_outno, t.tr_ob2, t.tr_inno);
        }
    }
}